

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O2

string * __thiscall
flatbuffers::kotlin::KotlinGenerator::GenDefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,KotlinGenerator *this,FieldDef *field,bool force_signed)

{
  BaseType BVar1;
  bool bVar2;
  BaseType type;
  char *__s;
  string suffix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  BVar1 = (field->value).type.base_type;
  if ((BVar1 - BASE_TYPE_UTYPE < 0xc) && (field->presence == kOptional)) {
    __s = "null";
  }
  else {
    if (BVar1 - BASE_TYPE_FLOAT < 2) {
      FloatConstantGenerator::GenFloatConstant_abi_cxx11_
                (__return_storage_ptr__,
                 (FloatConstantGenerator *)(anonymous_namespace)::KotlinFloatGen,field);
      if (BVar1 != BASE_TYPE_DOUBLE) {
        return __return_storage_ptr__;
      }
      if ((__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1]
          != 'f') {
        return __return_storage_ptr__;
      }
      std::__cxx11::string::pop_back();
      return __return_storage_ptr__;
    }
    if (BVar1 != BASE_TYPE_BOOL) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_60,"",(allocator<char> *)&local_40);
      if (BVar1 == BASE_TYPE_LONG || !force_signed) {
        LiteralSuffix_abi_cxx11_(&local_40,(KotlinGenerator *)(ulong)BVar1,type);
        std::__cxx11::string::operator=((string *)&local_60,(string *)&local_40);
        std::__cxx11::string::~string((string *)&local_40);
      }
      std::operator+(__return_storage_ptr__,&(field->value).constant,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      return __return_storage_ptr__;
    }
    bVar2 = std::operator==(&(field->value).constant,"0");
    __s = "true";
    if (bVar2) {
      __s = "false";
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::string GenDefaultValue(const FieldDef &field,
                              bool force_signed = false) const {
    auto &value = field.value;
    auto base_type = field.value.type.base_type;

    if (field.IsScalarOptional()) { return "null"; }
    if (IsFloat(base_type)) {
      auto val = KotlinFloatGen.GenFloatConstant(field);
      if (base_type == BASE_TYPE_DOUBLE && val.back() == 'f') {
        val.pop_back();
      }
      return val;
    }

    if (base_type == BASE_TYPE_BOOL) {
      return value.constant == "0" ? "false" : "true";
    }

    std::string suffix = "";

    if (base_type == BASE_TYPE_LONG || !force_signed) {
      suffix = LiteralSuffix(base_type);
    }
    return value.constant + suffix;
  }